

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O1

Reg ra_rematk(ASMState *as,IRRef ref)

{
  IRIns *ir;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  MCode *pMVar4;
  int iVar5;
  
  ir = as->ir + ref;
  bVar1 = (ir->field_1).r;
  uVar3 = 1 << (bVar1 & 0x1f);
  as->freeset = as->freeset | uVar3;
  as->modset = as->modset | uVar3;
  (ir->field_1).r = 0xff;
  bVar2 = (ir->field_1).o;
  uVar3 = (uint)bVar1;
  if (bVar2 < 0x1c) {
    if (bVar2 == 0xd) {
      (ir->field_1).r = 0x82;
      iVar5 = -0xb8;
    }
    else {
      if (bVar2 != 0x16) goto LAB_0014920b;
      iVar5 = -0xc0;
    }
    pMVar4 = as->mcp;
    *(int *)(pMVar4 + -4) = iVar5 + *(int *)&as->J;
    pMVar4[-5] = '%';
    pMVar4[-6] = bVar1 * '\b' & 0x38 | 4;
    pMVar4[-7] = 0x8b;
    if ((bVar1 & 8) == 0) {
      pMVar4 = pMVar4 + -7;
    }
    else {
      pMVar4[-8] = 'D';
      pMVar4 = pMVar4 + -8;
    }
    as->mcp = pMVar4;
  }
  else {
    if (bVar2 == 0x1d) {
      emit_loadu64(as,(uint)bVar1,(uint64_t)ir[1]);
      return uVar3;
    }
    if (bVar2 == 0x1c) {
      emit_loadk64(as,uVar3,ir);
      return uVar3;
    }
LAB_0014920b:
    emit_loadi(as,uVar3,ir->i);
  }
  return uVar3;
}

Assistant:

static Reg ra_rematk(ASMState *as, IRRef ref)
{
  IRIns *ir;
  Reg r;
  if (ra_iskref(ref)) {
    r = ra_krefreg(ref);
    lj_assertA(!rset_test(as->freeset, r), "rematk of free reg %d", r);
    ra_free(as, r);
    ra_modified(as, r);
#if LJ_64
    emit_loadu64(as, r, ra_krefk(as, ref));
#else
    emit_loadi(as, r, ra_krefk(as, ref));
#endif
    return r;
  }
  ir = IR(ref);
  r = ir->r;
  lj_assertA(ra_hasreg(r), "rematk of K%03d has no reg", REF_BIAS - ref);
  lj_assertA(!ra_hasspill(ir->s),
	     "rematk of K%03d has spill slot [%x]", REF_BIAS - ref, ir->s);
  ra_free(as, r);
  ra_modified(as, r);
  ir->r = RID_INIT;  /* Do not keep any hint. */
  RA_DBGX((as, "remat     $i $r", ir, r));
#if !LJ_SOFTFP32
  if (ir->o == IR_KNUM) {
    emit_loadk64(as, r, ir);
  } else
#endif
  if (emit_canremat(REF_BASE) && ir->o == IR_BASE) {
    ra_sethint(ir->r, RID_BASE);  /* Restore BASE register hint. */
    emit_getgl(as, r, jit_base);
  } else if (emit_canremat(ASMREF_L) && ir->o == IR_KPRI) {
    /* REF_NIL stores ASMREF_L register. */
    lj_assertA(irt_isnil(ir->t), "rematk of bad ASMREF_L");
    emit_getgl(as, r, cur_L);
#if LJ_64
  } else if (ir->o == IR_KINT64) {
    emit_loadu64(as, r, ir_kint64(ir)->u64);
#if LJ_GC64
  } else if (ir->o == IR_KGC) {
    emit_loadu64(as, r, (uintptr_t)ir_kgc(ir));
  } else if (ir->o == IR_KPTR || ir->o == IR_KKPTR) {
    emit_loadu64(as, r, (uintptr_t)ir_kptr(ir));
#endif
#endif
  } else {
    lj_assertA(ir->o == IR_KINT || ir->o == IR_KGC ||
	       ir->o == IR_KPTR || ir->o == IR_KKPTR || ir->o == IR_KNULL,
	       "rematk of bad IR op %d", ir->o);
    emit_loadi(as, r, ir->i);
  }
  return r;
}